

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

string * __thiscall
cmQtAutoMocUic::MocSettingsT::MacrosString_abi_cxx11_
          (string *__return_storage_ptr__,MocSettingsT *this)

{
  bool bVar1;
  pointer pKVar2;
  __normal_iterator<const_cmQtAutoMocUic::KeyExpT_*,_std::vector<cmQtAutoMocUic::KeyExpT,_std::allocator<cmQtAutoMocUic::KeyExpT>_>_>
  local_40;
  const_iterator itC;
  __normal_iterator<const_cmQtAutoMocUic::KeyExpT_*,_std::vector<cmQtAutoMocUic::KeyExpT,_std::allocator<cmQtAutoMocUic::KeyExpT>_>_>
  itL;
  const_iterator itE;
  const_iterator itB;
  MocSettingsT *this_local;
  string *res;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  itE = std::vector<cmQtAutoMocUic::KeyExpT,_std::allocator<cmQtAutoMocUic::KeyExpT>_>::cbegin
                  (&this->MacroFilters);
  itL._M_current =
       (KeyExpT *)
       std::vector<cmQtAutoMocUic::KeyExpT,_std::allocator<cmQtAutoMocUic::KeyExpT>_>::cend
                 (&this->MacroFilters);
  itC._M_current =
       (KeyExpT *)
       __gnu_cxx::
       __normal_iterator<const_cmQtAutoMocUic::KeyExpT_*,_std::vector<cmQtAutoMocUic::KeyExpT,_std::allocator<cmQtAutoMocUic::KeyExpT>_>_>
       ::operator-(&itL,1);
  local_40._M_current = itE._M_current;
  while (bVar1 = __gnu_cxx::operator!=(&local_40,&itL), bVar1) {
    bVar1 = __gnu_cxx::operator!=(&local_40,&itE);
    if (bVar1) {
      bVar1 = __gnu_cxx::operator!=(&local_40,&itC);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," or ");
      }
    }
    pKVar2 = __gnu_cxx::
             __normal_iterator<const_cmQtAutoMocUic::KeyExpT_*,_std::vector<cmQtAutoMocUic::KeyExpT,_std::allocator<cmQtAutoMocUic::KeyExpT>_>_>
             ::operator->(&local_40);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pKVar2);
    __gnu_cxx::
    __normal_iterator<const_cmQtAutoMocUic::KeyExpT_*,_std::vector<cmQtAutoMocUic::KeyExpT,_std::allocator<cmQtAutoMocUic::KeyExpT>_>_>
    ::operator++(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoMocUic::MocSettingsT::MacrosString() const
{
  std::string res;
  const auto itB = MacroFilters.cbegin();
  const auto itE = MacroFilters.cend();
  const auto itL = itE - 1;
  auto itC = itB;
  for (; itC != itE; ++itC) {
    // Separator
    if (itC != itB) {
      if (itC != itL) {
        res += ", ";
      } else {
        res += " or ";
      }
    }
    // Key
    res += itC->Key;
  }
  return res;
}